

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_221797::OriginPubkeyProvider::GetPubKey
          (OriginPubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key,KeyOriginInfo *info,
          DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  long lVar1;
  PubkeyProvider *pPVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = (this->m_provider)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
  iVar3 = (*pPVar2->_vptr_PubkeyProvider[2])(pPVar2,CONCAT44(in_register_00000034,pos));
  if (SUB41(iVar3,0) != false) {
    *(undefined4 *)info->fingerprint = *(undefined4 *)(this->m_origin).fingerprint;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&info->path,
               (const_iterator)
               (info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(this->m_origin).path.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(this->m_origin).path.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(iVar3,0);
  }
  __stack_chk_fail();
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key, KeyOriginInfo& info, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        if (!m_provider->GetPubKey(pos, arg, key, info, read_cache, write_cache)) return false;
        std::copy(std::begin(m_origin.fingerprint), std::end(m_origin.fingerprint), info.fingerprint);
        info.path.insert(info.path.begin(), m_origin.path.begin(), m_origin.path.end());
        return true;
    }